

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformdatabuilder.cpp
# Opt level: O2

QFormDataPartBuilder __thiscall
QFormDataPartBuilder::setBodyHelper
          (QFormDataPartBuilder *this,QByteArray *data,QAnyStringView name,QAnyStringView mimeType)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  QFormDataPartBuilderPrivate *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_48;
  size_t local_40;
  long local_38;
  
  local_40 = name.m_size;
  local_48 = name.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func(this);
  QAnyStringView::toString((QString *)&local_68,(QAnyStringView *)&local_48);
  pDVar2 = (pQVar4->m_originalBodyName).d.d;
  pcVar3 = (pQVar4->m_originalBodyName).d.ptr;
  (pQVar4->m_originalBodyName).d.d = local_68.d;
  (pQVar4->m_originalBodyName).d.ptr = local_68.ptr;
  qVar1 = (pQVar4->m_originalBodyName).d.size;
  (pQVar4->m_originalBodyName).d.size = local_68.size;
  local_68.d = pDVar2;
  local_68.ptr = pcVar3;
  local_68.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  convertInto(&pQVar4->m_mimeType,mimeType);
  std::variant<QIODevice*,QByteArray>::operator=
            ((variant<QIODevice*,QByteArray> *)&pQVar4->m_body,data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *this;
  }
  __stack_chk_fail();
}

Assistant:

QFormDataPartBuilder QFormDataPartBuilder::setBodyHelper(const QByteArray &data,
                                                         QAnyStringView name,
                                                         QAnyStringView mimeType)
{
    Q_D(QFormDataPartBuilder);

    d->m_originalBodyName = name.toString();
    convertInto(d->m_mimeType, mimeType);
    d->m_body = data;
    return *this;
}